

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadednormalizer2impl.cpp
# Opt level: O2

Normalizer2Impl * icu_63::Normalizer2Factory::getNFKCImpl(UErrorCode *errorCode)

{
  Norm2AllModes *pNVar1;
  Normalizer2Impl *pNVar2;
  
  pNVar1 = Norm2AllModes::getNFKCInstance(errorCode);
  if (pNVar1 == (Norm2AllModes *)0x0) {
    pNVar2 = (Normalizer2Impl *)0x0;
  }
  else {
    pNVar2 = pNVar1->impl;
  }
  return pNVar2;
}

Assistant:

const Normalizer2Impl *
Normalizer2Factory::getNFKCImpl(UErrorCode &errorCode) {
    const Norm2AllModes *allModes=Norm2AllModes::getNFKCInstance(errorCode);
    return allModes!=NULL ? allModes->impl : NULL;
}